

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O0

FT_Error pfr_phy_font_load(PFR_PhyFont phy_font,FT_Stream stream,FT_UInt32 offset,FT_UInt32 size)

{
  byte bVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  FT_Byte *limit_00;
  FT_Pointer pvVar6;
  uint *puVar7;
  uchar *puVar8;
  FT_Byte *pFVar9;
  uint local_98;
  uint local_94;
  uint local_90;
  PFR_Char cur;
  FT_UInt Size;
  FT_UInt count_1;
  FT_UInt n_1;
  FT_UInt count;
  FT_UInt n;
  FT_UInt type;
  FT_UInt length;
  FT_Byte *q2;
  FT_Byte *q;
  FT_Byte *limit;
  FT_Byte *p;
  FT_ULong num_aux;
  FT_Memory pFStack_30;
  FT_UInt flags;
  FT_Memory memory;
  uint local_20;
  FT_Error error;
  FT_UInt32 size_local;
  FT_UInt32 offset_local;
  FT_Stream stream_local;
  PFR_PhyFont phy_font_local;
  
  pFStack_30 = stream->memory;
  phy_font->memory = pFStack_30;
  phy_font->offset = offset;
  phy_font->kern_items = (PFR_KernItem_conflict)0x0;
  phy_font->kern_items_tail = &phy_font->kern_items;
  local_20 = size;
  error = offset;
  _size_local = stream;
  stream_local = (FT_Stream)phy_font;
  memory._4_4_ = FT_Stream_Seek(stream,(ulong)offset);
  if (memory._4_4_ != 0) {
    return memory._4_4_;
  }
  memory._4_4_ = FT_Stream_EnterFrame(_size_local,(ulong)local_20);
  if (memory._4_4_ != 0) {
    return memory._4_4_;
  }
  stream_local[2].limit = _size_local->cursor;
  pFVar9 = _size_local->cursor;
  limit_00 = pFVar9 + local_20;
  limit = pFVar9;
  if (pFVar9 + 0xf <= limit_00) {
    *(uint *)((long)&stream_local->size + 4) = (uint)CONCAT11(*pFVar9,pFVar9[1]);
    *(uint *)&stream_local->pos = (uint)CONCAT11(pFVar9[2],pFVar9[3]);
    *(uint *)((long)&stream_local->pos + 4) = (uint)CONCAT11(pFVar9[4],pFVar9[5]);
    stream_local->descriptor = (FT_StreamDesc)(long)CONCAT11(pFVar9[6],pFVar9[7]);
    stream_local->pathname = (FT_StreamDesc)(long)CONCAT11(pFVar9[8],pFVar9[9]);
    stream_local->read = (FT_Stream_IoFunc)(long)CONCAT11(pFVar9[10],pFVar9[0xb]);
    stream_local->close = (FT_Stream_CloseFunc)(long)CONCAT11(pFVar9[0xc],pFVar9[0xd]);
    limit = pFVar9 + 0xf;
    bVar1 = pFVar9[0xe];
    num_aux._4_4_ = (uint)bVar1;
    *(uint *)&stream_local->memory = num_aux._4_4_;
    if ((bVar1 & 4) == 0) {
      if (limit_00 < pFVar9 + 0x11) goto LAB_002fde3a;
      limit = pFVar9 + 0x11;
      *(int *)((long)&stream_local->memory + 4) = (int)CONCAT11(pFVar9[0xf],pFVar9[0x10]);
    }
    iVar2 = 0;
    if (((bVar1 & 0x80) != 0) &&
       (memory._4_4_ = pfr_extra_items_parse(&limit,limit_00,pfr_phy_font_extra_items,stream_local),
       iVar2 = memory._4_4_, memory._4_4_ != 0)) goto LAB_002fddff;
    memory._4_4_ = iVar2;
    if (limit + 3 <= limit_00) {
      q2 = limit + 3;
      p = (FT_Byte *)(ulong)((uint)*limit << 0x10 | (uint)limit[1] << 8 | (uint)limit[2]);
      limit = q2;
      if (p != (FT_Byte *)0x0) {
        if (limit_00 < q2 + (long)p) goto LAB_002fde3a;
        limit = p + (long)q2;
        for (; (((p != (FT_Byte *)0x0 && (q2 + 4 <= limit)) &&
                (uVar4 = (uint)CONCAT11(*q2,q2[1]), 3 < uVar4)) && ((FT_Byte *)(ulong)uVar4 <= p));
            p = p + -(ulong)uVar4) {
          uVar3 = *(ushort *)(q2 + 2) << 8 | *(ushort *)(q2 + 2) >> 8;
          if (uVar3 == 1) {
            memory._4_4_ = pfr_aux_name_load(q2 + 4,uVar4 - 4,pFStack_30,
                                             (FT_String **)&stream_local[1].read);
joined_r0x002fd832:
            if (memory._4_4_ != 0) {
              return memory._4_4_;
            }
          }
          else if (uVar3 == 2) {
            if (q2 + 0x24 <= q2 + uVar4) {
              *(int *)&stream_local->cursor = (int)CONCAT11(q2[0xe],q2[0xf]);
              *(int *)((long)&stream_local->cursor + 4) = (int)CONCAT11(q2[0x10],q2[0x11]);
              *(int *)&stream_local->limit = (int)CONCAT11(q2[0x12],q2[0x13]);
            }
          }
          else if (uVar3 == 3) {
            memory._4_4_ = pfr_aux_name_load(q2 + 4,uVar4 - 4,pFStack_30,
                                             (FT_String **)&stream_local[1].close);
            goto joined_r0x002fd832;
          }
          q2 = q2 + uVar4;
        }
      }
      if (limit + 1 <= limit_00) {
        pFVar9 = limit + 1;
        bVar1 = *limit;
        uVar4 = (uint)bVar1;
        *(uint *)&stream_local[1].limit = uVar4;
        limit = pFVar9;
        if (pFVar9 + (ulong)bVar1 * 2 <= limit_00) {
          puVar8 = (uchar *)ft_mem_realloc(pFStack_30,4,0,(ulong)uVar4,(void *)0x0,
                                           (FT_Error *)((long)&memory + 4));
          stream_local[2].base = puVar8;
          if (memory._4_4_ != 0) goto LAB_002fddff;
          for (n_1 = 0; n_1 < uVar4; n_1 = n_1 + 1) {
            *(int *)(stream_local[2].base + (ulong)n_1 * 4) = (int)CONCAT11(*limit,limit[1]);
            limit = limit + 2;
          }
          if (limit + 8 <= limit_00) {
            *(uint *)&stream_local[2].size = (uint)*limit;
            *(uint *)((long)&stream_local[2].size + 4) = (uint)limit[1];
            *(uint *)&stream_local[1].pos = (uint)CONCAT11(limit[2],limit[3]);
            *(uint *)&stream_local[1].base = (uint)CONCAT11(limit[4],limit[5]);
            pFVar9 = limit + 8;
            uVar4 = (uint)CONCAT11(limit[6],limit[7]);
            *(uint *)&stream_local[2].pos = uVar4;
            stream_local[2].descriptor.pointer =
                 pFVar9 + ((ulong)(uint)error - (long)_size_local->cursor);
            cur._4_4_ = 4;
            if ((num_aux._4_4_ & 2) != 0) {
              cur._4_4_ = 5;
            }
            if ((num_aux._4_4_ & 4) != 0) {
              cur._4_4_ = cur._4_4_ + 2;
            }
            if ((num_aux._4_4_ & 8) != 0) {
              cur._4_4_ = cur._4_4_ + 1;
            }
            if ((num_aux._4_4_ & 0x10) != 0) {
              cur._4_4_ = cur._4_4_ + 1;
            }
            if ((num_aux._4_4_ & 0x20) != 0) {
              cur._4_4_ = cur._4_4_ + 1;
            }
            limit = pFVar9;
            if (pFVar9 + uVar4 * cur._4_4_ <= limit_00) {
              pvVar6 = ft_mem_realloc(pFStack_30,0x10,0,(ulong)uVar4,(void *)0x0,
                                      (FT_Error *)((long)&memory + 4));
              stream_local[2].pathname.pointer = pvVar6;
              if (memory._4_4_ == 0) {
                for (Size = 0; Size < uVar4; Size = Size + 1) {
                  puVar7 = (uint *)((long)stream_local[2].pathname.pointer + (ulong)Size * 0x10);
                  if ((num_aux._4_4_ & 2) == 0) {
                    local_90 = (uint)*limit;
                    limit = limit + 1;
                  }
                  else {
                    local_90 = (uint)CONCAT11(*limit,limit[1]);
                    limit = limit + 2;
                  }
                  *puVar7 = local_90;
                  if ((num_aux._4_4_ & 4) == 0) {
                    local_94 = *(uint *)((long)&stream_local->memory + 4);
                  }
                  else {
                    local_94 = (uint)CONCAT11(*limit,limit[1]);
                    limit = limit + 2;
                  }
                  puVar7[1] = local_94;
                  if ((num_aux._4_4_ & 8) != 0) {
                    limit = limit + 1;
                  }
                  if ((num_aux._4_4_ & 0x10) == 0) {
                    local_98 = (uint)*limit;
                    limit = limit + 1;
                  }
                  else {
                    local_98 = (uint)CONCAT11(*limit,limit[1]);
                    limit = limit + 2;
                  }
                  puVar7[2] = local_98;
                  if ((num_aux._4_4_ & 0x20) == 0) {
                    uVar5 = (uint)CONCAT11(*limit,limit[1]);
                    limit = limit + 2;
                  }
                  else {
                    uVar5 = (uint)*limit << 0x10 | (uint)limit[1] << 8 | (uint)limit[2];
                    limit = limit + 3;
                  }
                  puVar7[3] = uVar5;
                }
              }
              goto LAB_002fddff;
            }
          }
        }
      }
    }
  }
LAB_002fde3a:
  memory._4_4_ = 8;
LAB_002fddff:
  FT_Stream_ExitFrame(_size_local);
  puVar8 = (uchar *)FT_Stream_Pos(_size_local);
  stream_local[2].cursor = puVar8;
  stream_local[2].limit = (uchar *)0x0;
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_phy_font_load( PFR_PhyFont  phy_font,
                     FT_Stream    stream,
                     FT_UInt32    offset,
                     FT_UInt32    size )
  {
    FT_Error   error;
    FT_Memory  memory = stream->memory;
    FT_UInt    flags;
    FT_ULong   num_aux;
    FT_Byte*   p;
    FT_Byte*   limit;


    phy_font->memory = memory;
    phy_font->offset = offset;

    phy_font->kern_items      = NULL;
    phy_font->kern_items_tail = &phy_font->kern_items;

    if ( FT_STREAM_SEEK( offset ) ||
         FT_FRAME_ENTER( size )   )
      goto Exit;

    phy_font->cursor = stream->cursor;

    p     = stream->cursor;
    limit = p + size;

    PFR_CHECK( 15 );
    phy_font->font_ref_number    = PFR_NEXT_USHORT( p );
    phy_font->outline_resolution = PFR_NEXT_USHORT( p );
    phy_font->metrics_resolution = PFR_NEXT_USHORT( p );
    phy_font->bbox.xMin          = PFR_NEXT_SHORT( p );
    phy_font->bbox.yMin          = PFR_NEXT_SHORT( p );
    phy_font->bbox.xMax          = PFR_NEXT_SHORT( p );
    phy_font->bbox.yMax          = PFR_NEXT_SHORT( p );
    phy_font->flags      = flags = PFR_NEXT_BYTE( p );

    /* get the standard advance for non-proportional fonts */
    if ( !(flags & PFR_PHY_PROPORTIONAL) )
    {
      PFR_CHECK( 2 );
      phy_font->standard_advance = PFR_NEXT_SHORT( p );
    }

    /* load the extra items when present */
    if ( flags & PFR_PHY_EXTRA_ITEMS )
    {
      error = pfr_extra_items_parse( &p, limit,
                                     pfr_phy_font_extra_items, phy_font );

      if ( error )
        goto Fail;
    }

    /* In certain fonts, the auxiliary bytes contain interesting   */
    /* information.  These are not in the specification but can be */
    /* guessed by looking at the content of a few PFR0 fonts.      */
    PFR_CHECK( 3 );
    num_aux = PFR_NEXT_ULONG( p );

    if ( num_aux > 0 )
    {
      FT_Byte*  q = p;
      FT_Byte*  q2;


      PFR_CHECK_SIZE( num_aux );
      p += num_aux;

      while ( num_aux > 0 )
      {
        FT_UInt  length, type;


        if ( q + 4 > p )
          break;

        length = PFR_NEXT_USHORT( q );
        if ( length < 4 || length > num_aux )
          break;

        q2   = q + length - 2;
        type = PFR_NEXT_USHORT( q );

        switch ( type )
        {
        case 1:
          /* this seems to correspond to the font's family name, padded to */
          /* an even number of bytes with a zero byte appended if needed   */
          error = pfr_aux_name_load( q, length - 4U, memory,
                                     &phy_font->family_name );
          if ( error )
            goto Exit;
          break;

        case 2:
          if ( q + 32 > q2 )
            break;

          q += 10;
          phy_font->ascent  = PFR_NEXT_SHORT( q );
          phy_font->descent = PFR_NEXT_SHORT( q );
          phy_font->leading = PFR_NEXT_SHORT( q );
          break;

        case 3:
          /* this seems to correspond to the font's style name, padded to */
          /* an even number of bytes with a zero byte appended if needed  */
          error = pfr_aux_name_load( q, length - 4U, memory,
                                     &phy_font->style_name );
          if ( error )
            goto Exit;
          break;

        default:
          ;
        }

        q        = q2;
        num_aux -= length;
      }
    }

    /* read the blue values */
    {
      FT_UInt  n, count;


      PFR_CHECK( 1 );
      phy_font->num_blue_values = count = PFR_NEXT_BYTE( p );

      PFR_CHECK( count * 2 );

      if ( FT_NEW_ARRAY( phy_font->blue_values, count ) )
        goto Fail;

      for ( n = 0; n < count; n++ )
        phy_font->blue_values[n] = PFR_NEXT_SHORT( p );
    }

    PFR_CHECK( 8 );
    phy_font->blue_fuzz  = PFR_NEXT_BYTE( p );
    phy_font->blue_scale = PFR_NEXT_BYTE( p );

    phy_font->vertical.standard   = PFR_NEXT_USHORT( p );
    phy_font->horizontal.standard = PFR_NEXT_USHORT( p );

    /* read the character descriptors */
    {
      FT_UInt  n, count, Size;


      phy_font->num_chars    = count = PFR_NEXT_USHORT( p );
      phy_font->chars_offset = offset + (FT_Offset)( p - stream->cursor );

      Size = 1 + 1 + 2;
      if ( flags & PFR_PHY_2BYTE_CHARCODE )
        Size += 1;

      if ( flags & PFR_PHY_PROPORTIONAL )
        Size += 2;

      if ( flags & PFR_PHY_ASCII_CODE )
        Size += 1;

      if ( flags & PFR_PHY_2BYTE_GPS_SIZE )
        Size += 1;

      if ( flags & PFR_PHY_3BYTE_GPS_OFFSET )
        Size += 1;

      PFR_CHECK_SIZE( count * Size );

      if ( FT_NEW_ARRAY( phy_font->chars, count ) )
        goto Fail;

      for ( n = 0; n < count; n++ )
      {
        PFR_Char  cur = &phy_font->chars[n];


        cur->char_code = ( flags & PFR_PHY_2BYTE_CHARCODE )
                         ? PFR_NEXT_USHORT( p )
                         : PFR_NEXT_BYTE( p );

        cur->advance   = ( flags & PFR_PHY_PROPORTIONAL )
                         ? PFR_NEXT_SHORT( p )
                         : phy_font->standard_advance;

#if 0
        cur->ascii     = ( flags & PFR_PHY_ASCII_CODE )
                         ? PFR_NEXT_BYTE( p )
                         : 0;
#else
        if ( flags & PFR_PHY_ASCII_CODE )
          p += 1;
#endif
        cur->gps_size  = ( flags & PFR_PHY_2BYTE_GPS_SIZE )
                         ? PFR_NEXT_USHORT( p )
                         : PFR_NEXT_BYTE( p );

        cur->gps_offset = ( flags & PFR_PHY_3BYTE_GPS_OFFSET )
                          ? PFR_NEXT_ULONG( p )
                          : PFR_NEXT_USHORT( p );
      }
    }

    /* that's it! */

  Fail:
    FT_FRAME_EXIT();

    /* save position of bitmap info */
    phy_font->bct_offset = FT_STREAM_POS();
    phy_font->cursor     = NULL;

  Exit:
    return error;

  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_phy_font_load: invalid physical font table\n" ));
    goto Fail;
  }